

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O0

string_view gmlc::utilities::string_viewOps::merge(string_view string1,string_view string2)

{
  string_view sVar1;
  bool bVar2;
  const_pointer pvVar3;
  const_pointer pvVar4;
  size_type sVar5;
  size_type sVar6;
  out_of_range *this;
  char *in_RCX;
  size_t in_RDX;
  char *in_RSI;
  size_t in_RDI;
  ptrdiff_t diff;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_30._M_len = in_RDX;
  local_30._M_str = in_RCX;
  local_20._M_len = in_RDI;
  local_20._M_str = in_RSI;
  pvVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_30);
  pvVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_20);
  sVar5 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::length(&local_20);
  pvVar3 = pvVar3 + (-sVar5 - (long)pvVar4);
  if (((long)pvVar3 < 0) || (0x17 < (long)pvVar3)) {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&local_20);
    if (bVar2) {
      local_10._M_len = local_30._M_len;
      local_10._M_str = local_30._M_str;
    }
    else {
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_30);
      if (!bVar2) {
        this = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(this,"unable to merge string_views");
        __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      local_10._M_len = local_20._M_len;
      local_10._M_str = local_20._M_str;
    }
  }
  else {
    pvVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_20);
    sVar5 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::length(&local_20);
    sVar6 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::length(&local_30);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_10,pvVar4,(size_type)(pvVar3 + sVar6 + sVar5));
  }
  sVar1._M_str = local_10._M_str;
  sVar1._M_len = local_10._M_len;
  return sVar1;
}

Assistant:

std::string_view merge(std::string_view string1, std::string_view string2)
{
    ptrdiff_t diff = (string2.data() - string1.data()) -
        static_cast<ptrdiff_t>(string1.length());
    if ((diff >= 0) &&
        (diff < 24))  // maximum of 23 characters between the strings
    {
        return {string1.data(), diff + string1.length() + string2.length()};
    }
    if (string1.empty()) {
        return string2;
    }
    if (string2.empty()) {
        return string1;
    }
    throw(std::out_of_range("unable to merge string_views"));
}